

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O2

UINT8 device_start_k051649(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  UINT32 UVar2;
  int iVar3;
  DEV_DATA chip;
  void *pvVar4;
  int *piVar5;
  UINT8 UVar6;
  ulong uVar7;
  int *piVar8;
  
  chip.chipInf = calloc(1,0x108);
  if ((DEV_DATA *)chip.chipInf == (DEV_DATA *)0x0) {
    UVar6 = 0xff;
  }
  else {
    *(UINT8 *)((long)chip.chipInf + 0x102) = cfg->flags;
    uVar1 = cfg->clock;
    *(uint *)((long)chip.chipInf + 0xe4) = uVar1;
    *(uint *)&((DEV_DATA *)((long)chip.chipInf + 0xe8))->chipInf = uVar1 >> 4;
    pvVar4 = malloc(0x2800);
    ((DEV_DATA *)((long)chip.chipInf + 0xf0))->chipInf = pvVar4;
    piVar5 = (int *)((long)pvVar4 + 0x1400);
    ((DEV_DATA *)((long)chip.chipInf + 0xf8))->chipInf = piVar5;
    piVar8 = piVar5;
    for (uVar7 = 0; uVar7 != 0x28000; uVar7 = uVar7 + 0x80) {
      iVar3 = (int)((uVar7 & 0xffffffff) / 5);
      *piVar5 = iVar3;
      *piVar8 = -iVar3;
      piVar8 = piVar8 + -1;
      piVar5 = piVar5 + 1;
    }
    UVar6 = '\0';
    k051649_set_mute_mask(chip.chipInf,0);
    *(void **)chip.chipInf = chip.chipInf;
    UVar2 = *(UINT32 *)((long)chip.chipInf + 0xe8);
    retDevInf->dataPtr = (DEV_DATA *)chip.chipInf;
    retDevInf->sampleRate = UVar2;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar6;
}

Assistant:

static UINT8 device_start_k051649(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	k051649_state *info;

	info = (k051649_state *)calloc(1, sizeof(k051649_state));
	if (info == NULL)
		return 0xFF;

	// get stream channels
	info->mode_plus = cfg->flags;
	info->mclock = cfg->clock;
	info->rate = info->mclock / 16;

	// build the mixer table
	make_mixer_table(info, 5);
	
	k051649_set_mute_mask(info, 0x00);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->rate, &devDef);
	return 0x00;
}